

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  __pid_t _Var2;
  long *plVar3;
  int __sig;
  string *psVar4;
  void *__stat_loc;
  ulong uVar5;
  size_t *psVar6;
  undefined1 local_558 [8];
  MyProcess pipe_input;
  MyProcess pipe_output;
  MyProcess kill_example;
  MyProcess env_example;
  MyProcess process;
  MyProcessEnvironment env;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  string local_260;
  long *local_240 [2];
  long local_230 [2];
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  psVar6 = &env.env._M_t._M_impl.super__Rb_tree_header._M_node_count;
  env.env._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"redirection_example","");
  MyProcess::MyProcess
            ((MyProcess *)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)env.env._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_270) {
    operator_delete((void *)env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_270._M_allocated_capacity + 1);
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"../Test/In/redirection_in.txt","");
  MyProcess::set_input_file
            ((MyProcess *)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"arg1 arg2 arg3","");
  std::__cxx11::string::_M_assign((string *)(process.program_name.field_2._M_local_buf + 8));
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"../Test/Out/redirection_out.txt","");
  psVar4 = &local_220;
  MyProcess::set_output_file
            ((MyProcess *)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    psVar4 = (string *)(local_220.field_2._M_allocated_capacity + 1);
    operator_delete(local_220._M_dataplus._M_p,(ulong)psVar4);
  }
  MyProcess::start((MyProcess *)
                   &env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  _Var2 = MyProcess::wait((MyProcess *)
                          &env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          psVar4);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,_Var2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"pipe_input","");
  MyProcess::MyProcess((MyProcess *)local_558,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"pipe_output","");
  MyProcess::MyProcess
            ((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"../Test/In/pipe_in.txt","");
  MyProcess::set_input_file((MyProcess *)local_558,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  MyProcess::set_output_process
            ((MyProcess *)local_558,
             (MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,"../Test/Out/pipe_out.txt","");
  psVar4 = &local_1a0;
  MyProcess::set_output_file
            ((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    psVar4 = (string *)(local_1a0.field_2._M_allocated_capacity + 1);
    operator_delete(local_1a0._M_dataplus._M_p,(ulong)psVar4);
  }
  MyProcess::start((MyProcess *)local_558);
  MyProcess::start((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count
                  );
  _Var2 = MyProcess::wait((MyProcess *)local_558,psVar4);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,_Var2);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  __stat_loc = (void *)(ulong)(uint)(int)cVar1;
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  _Var2 = MyProcess::wait((MyProcess *)
                          &pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          __stat_loc);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,_Var2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"kill_example","");
  MyProcess::MyProcess
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"../Test/In/kill_in.txt","");
  MyProcess::set_input_file
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"../Test/Out/kill_out.txt","");
  psVar4 = &local_140;
  MyProcess::set_output_file
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             psVar4);
  _Var2 = (__pid_t)psVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    uVar5 = local_140.field_2._M_allocated_capacity + 1;
    operator_delete(local_140._M_dataplus._M_p,uVar5);
    _Var2 = (__pid_t)uVar5;
  }
  MyProcess::start((MyProcess *)
                   &pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sleep(5);
  MyProcess::kill((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count
                  ,_Var2,__sig);
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&env;
  env.env._M_t._M_impl._0_4_ = 0;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       env.env._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"key1","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"value1","");
  MyProcessEnvironment::set
            ((MyProcessEnvironment *)
             &process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_120,&local_100
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"key2","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"value2","");
  MyProcessEnvironment::set
            ((MyProcessEnvironment *)
             &process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_e0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"key3","");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"value3","");
  MyProcessEnvironment::set
            ((MyProcessEnvironment *)
             &process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_a0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"environment_vars_example","")
  ;
  MyProcess::MyProcess
            ((MyProcess *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"../Test/Out/env_example_out.txt","");
  MyProcess::set_output_file
            ((MyProcess *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  psVar6 = &process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&env_example.out,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)psVar6);
  MyProcess::start((MyProcess *)
                   &kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  _Var2 = MyProcess::wait((MyProcess *)
                          &kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          psVar6);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,_Var2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  MyProcess::~MyProcess
            ((MyProcess *)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::~MyProcess
            ((MyProcess *)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::~MyProcess
            ((MyProcess *)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  MyProcess::~MyProcess((MyProcess *)local_558);
  MyProcess::~MyProcess
            ((MyProcess *)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    MyProcess process("redirection_example");
    process.set_input_file("../Test/In/redirection_in.txt");
    process.set_arguments("arg1 arg2 arg3");
    process.set_output_file("../Test/Out/redirection_out.txt");
    process.start();
    std::cout << process.wait() << std::endl;


    MyProcess pipe_input("pipe_input");
    MyProcess pipe_output("pipe_output");
    pipe_input.set_input_file("../Test/In/pipe_in.txt");
    pipe_input.set_output_process(pipe_output);
    pipe_output.set_output_file("../Test/Out/pipe_out.txt");

    pipe_input.start();
    pipe_output.start();
    std::cout << pipe_input.wait() << std::endl;
    std::cout << pipe_output.wait() << std::endl;

    MyProcess kill_example("kill_example");
    kill_example.set_input_file("../Test/In/kill_in.txt");
    kill_example.set_output_file("../Test/Out/kill_out.txt");
    kill_example.start();

#if defined(__linux__) || defined(__APPLE__)
    sleep(5);
#elif _WIN32
    Sleep(5000);
#endif

    kill_example.kill();

    MyProcessEnvironment env;
    env.set("key1", "value1");
    env.set("key2", "value2");
    env.set("key3", "value3");

    MyProcess env_example("environment_vars_example");
    env_example.set_output_file("../Test/Out/env_example_out.txt");
    env_example.set_environment(env);

    env_example.start();
    std::cout << env_example.wait() << std::endl;

    return 0;
}